

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidatorUtils-inl.hpp
# Opt level: O0

WeightParamType CoreML::valueType(WeightParams *param)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  int nw;
  WeightParams *param_local;
  
  iVar2 = numberOfWeightType(param);
  if (iVar2 < 2) {
    if (iVar2 == 0) {
      param_local._4_4_ = EMPTY;
    }
    else {
      iVar2 = Specification::WeightParams::floatvalue_size(param);
      if (iVar2 < 1) {
        Specification::WeightParams::float16value_abi_cxx11_(param);
        lVar3 = std::__cxx11::string::size();
        if (lVar3 == 0) {
          Specification::WeightParams::rawvalue_abi_cxx11_(param);
          lVar3 = std::__cxx11::string::size();
          if ((lVar3 == 0) || (bVar1 = Specification::WeightParams::has_quantization(param), !bVar1)
             ) {
            Specification::WeightParams::int8rawvalue_abi_cxx11_(param);
            lVar3 = std::__cxx11::string::size();
            if ((lVar3 == 0) ||
               (bVar1 = Specification::WeightParams::has_quantization(param), !bVar1)) {
              param_local._4_4_ = EMPTY;
            }
            else {
              param_local._4_4_ = QINT;
            }
          }
          else {
            param_local._4_4_ = QUINT;
          }
        }
        else {
          param_local._4_4_ = FLOAT16;
        }
      }
      else {
        param_local._4_4_ = FLOAT32;
      }
    }
  }
  else {
    param_local._4_4_ = UNSPECIFIED;
  }
  return param_local._4_4_;
}

Assistant:

inline WeightParamType valueType(const Specification::WeightParams &param) {
        int nw = numberOfWeightType(param);
        // Ensure only one field is set
        if (nw > 1){
            return UNSPECIFIED;
        }
        if (nw == 0){
            return EMPTY;
        }
        if (param.floatvalue_size() > 0) {
            return FLOAT32;
        } else if (param.float16value().size() > 0) {
            return FLOAT16;
        } else if (param.rawvalue().size() > 0 && param.has_quantization()) {
            return QUINT;
        } else if (param.int8rawvalue().size() > 0 && param.has_quantization()) {
            return QINT;
        }
        return EMPTY;
    }